

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinarySearchTree.cpp
# Opt level: O2

void __thiscall BinarySearchTree::find(BinarySearchTree *this,int value,Node **par,Node **loc)

{
  Node *pNVar1;
  Node *pNVar2;
  int iVar3;
  
  pNVar1 = this->root;
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = (Node *)0x0;
  }
  else {
    iVar3 = pNVar1->value;
    if (iVar3 != value) {
      do {
        pNVar2 = pNVar1;
        pNVar1 = (&pNVar2->leftChild)[iVar3 <= value];
        if (pNVar1 == (Node *)0x0) {
          pNVar1 = (Node *)0x0;
          break;
        }
        iVar3 = pNVar1->value;
      } while (iVar3 != value);
      goto LAB_00106a8b;
    }
  }
  pNVar2 = (Node *)0x0;
LAB_00106a8b:
  *loc = pNVar1;
  *par = pNVar2;
  return;
}

Assistant:

void BinarySearchTree::find(int value, Node **par, Node **loc) {
    Node *ptr, *ptrSave;
    if (root == nullptr) {
        *loc = nullptr;
        *par = nullptr;
        return;
    }
    if (value == root->value) {
        *loc = root;
        *par = nullptr;
        return;
    }
    if (value < root->value) {
        ptr = root->leftChild;
    } else {
        ptr = root->rightChild;
    }
    ptrSave = root;
    while (ptr != nullptr) {
        if (value == ptr->value) {
            *loc = ptr;
            *par = ptrSave;
            return;
        }
        ptrSave = ptr;
        if (value < ptr->value) {
            ptr = ptr->leftChild;
        } else {
            ptr = ptr->rightChild;
        }
    }
    *loc = nullptr;
    *par = ptrSave;
}